

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O2

void __thiscall QDial::mouseMoveEvent(QDial *this,QMouseEvent *e)

{
  QDialPrivate *this_00;
  int position;
  long in_FS_OFFSET;
  QPointF local_30;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)e[0x44] & 1) == 0) {
    e[0xc] = (QMouseEvent)0x0;
  }
  else {
    this_00 = *(QDialPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
    e[0xc] = (QMouseEvent)0x1;
    this_00->field_0x298 = this_00->field_0x298 | 4;
    local_30 = QSinglePointEvent::position((QSinglePointEvent *)e);
    local_20 = QPointF::toPoint(&local_30);
    position = QDialPrivate::valueFromPoint(this_00,&local_20);
    QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,position);
    this_00->field_0x298 = this_00->field_0x298 & 0xfb;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDial::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QDial);
    if (!(e->buttons() & Qt::LeftButton)) {
        e->ignore();
        return;
    }
    e->accept();
    d->doNotEmit = true;
    setSliderPosition(d->valueFromPoint(e->position().toPoint()));
    d->doNotEmit = false;
}